

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bench.cc
# Opt level: O0

void time_map_toggle<EasyUseMap<HashObject<4,4>,int>>(int iters)

{
  int iVar1;
  map<HashObject<4,_4>,_int,_std::less<HashObject<4,_4>_>,_std::allocator<std::pair<const_HashObject<4,_4>,_int>_>_>
  *this;
  int in_EDI;
  size_t unaff_retaddr;
  size_t in_stack_00000008;
  int in_stack_00000014;
  size_t finish;
  double ut;
  size_t start;
  int i;
  Rusage t;
  EasyUseMap<HashObject<4,_4>,_int> set;
  key_type *in_stack_ffffffffffffff78;
  Rusage *in_stack_ffffffffffffff80;
  Rusage *in_stack_ffffffffffffff90;
  HashObject<4,_4> local_60;
  HashObject<4,_4> local_5c;
  size_t local_58;
  int local_50;
  key_type *in_stack_ffffffffffffffb8;
  map<HashObject<4,_4>,_int,_std::less<HashObject<4,_4>_>,_std::allocator<std::pair<const_HashObject<4,_4>,_int>_>_>
  *in_stack_ffffffffffffffc0;
  
  EasyUseMap<HashObject<4,_4>,_int>::EasyUseMap((EasyUseMap<HashObject<4,_4>,_int> *)0x1d64a8);
  Rusage::Rusage(in_stack_ffffffffffffff80);
  local_58 = CurrentMemoryUsage();
  Rusage::Reset(in_stack_ffffffffffffff80);
  for (local_50 = 0; local_50 < in_EDI; local_50 = local_50 + 1) {
    iVar1 = local_50 + 1;
    HashObject<4,_4>::HashObject(&local_5c,local_50);
    this = (map<HashObject<4,_4>,_int,_std::less<HashObject<4,_4>_>,_std::allocator<std::pair<const_HashObject<4,_4>,_int>_>_>
            *)std::
              map<HashObject<4,_4>,_int,_std::less<HashObject<4,_4>_>,_std::allocator<std::pair<const_HashObject<4,_4>,_int>_>_>
              ::operator[](in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
    *(int *)&(this->_M_t)._M_impl = iVar1;
    HashObject<4,_4>::HashObject(&local_60,local_50);
    std::
    map<HashObject<4,_4>,_int,_std::less<HashObject<4,_4>_>,_std::allocator<std::pair<const_HashObject<4,_4>,_int>_>_>
    ::erase(this,in_stack_ffffffffffffff78);
  }
  Rusage::UserTime(in_stack_ffffffffffffff90);
  CurrentMemoryUsage();
  report((char *)ut,(double)finish,in_stack_00000014,in_stack_00000008,unaff_retaddr);
  EasyUseMap<HashObject<4,_4>,_int>::~EasyUseMap((EasyUseMap<HashObject<4,_4>,_int> *)0x1d65b9);
  return;
}

Assistant:

static void time_map_toggle(int iters) {
  MapType set;
  Rusage t;
  int i;

  const size_t start = CurrentMemoryUsage();
  t.Reset();
  for (i = 0; i < iters; i++) {
    set[i] = i + 1;
    set.erase(i);
  }

  double ut = t.UserTime();
  const size_t finish = CurrentMemoryUsage();

  report("map_toggle", ut, iters, start, finish);
}